

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O1

bool __thiscall
google::protobuf::UnknownFieldSet::SerializeToString(UnknownFieldSet *this,string *output)

{
  size_t new_size;
  
  new_size = internal::WireFormat::ComputeUnknownFieldsSize(this);
  absl::lts_20250127::strings_internal::STLStringResizeUninitializedAmortized<std::__cxx11::string>
            (output,new_size);
  internal::WireFormat::SerializeUnknownFieldsToArray(this,(uint8_t *)(output->_M_dataplus)._M_p);
  return true;
}

Assistant:

bool UnknownFieldSet::SerializeToString(std::string* output) const {
  const size_t size =
      google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(*this);
  absl::strings_internal::STLStringResizeUninitializedAmortized(output, size);
  google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
      *this, reinterpret_cast<uint8_t*>(const_cast<char*>(output->data())));
  return true;
}